

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  FieldType FVar1;
  type_info *ptVar2;
  int iVar3;
  LogMessage *pLVar4;
  void *pvVar5;
  int *piVar6;
  uint *puVar7;
  long *plVar8;
  ulong uVar9;
  ulong *puVar10;
  unsigned_long *puVar11;
  undefined4 extraout_var;
  Type *pTVar12;
  undefined4 extraout_var_00;
  Type *pTVar13;
  uint uVar14;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  undefined4 in_register_00000034;
  RepeatedField<unsigned_int> *pRVar18;
  RepeatedField<int> *pRVar19;
  RepeatedField<long> *pRVar20;
  RepeatedField<unsigned_long> *pRVar21;
  string *psVar22;
  int iVar23;
  FieldType FVar24;
  bool bVar25;
  LogMessage local_70;
  LogFinisher local_31;
  
  pLVar4 = (LogMessage *)CONCAT44(in_register_00000034,number);
  if (this->is_repeated != true) {
    if ((this->field_0xa & 1) != 0) {
      return 0;
    }
    FVar1 = this->type;
    if ((byte)(FVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
      bVar25 = (byte)(this->type - 0x13) < 0xee;
      in_RDX = extraout_RDX;
      FVar24 = this->type;
    }
    else {
      bVar25 = false;
      FVar24 = FVar1;
    }
    uVar14 = number * 8 + 1;
    iVar23 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
    sVar16 = (ulong)(iVar23 * 9 + 0x49U >> 6) << (FVar1 == '\n');
    if (bVar25) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
      in_RDX = extraout_RDX_00;
    }
    switch(FVar24) {
    case '\x01':
    case '\x06':
    case '\x10':
      return sVar16 + 8;
    case '\x02':
    case '\a':
    case '\x0f':
      return sVar16 + 4;
    case '\x03':
    case '\x04':
      uVar17 = (this->field_0).uint64_value;
      goto LAB_0021e3d3;
    case '\x05':
    case '\x0e':
      pvVar5 = (void *)(ulong)(uint)(this->field_0).int32_value;
      if ((this->field_0).int32_value < 0) {
        pvVar5 = (void *)0xa;
        goto LAB_0021e507;
      }
      break;
    case '\b':
      return sVar16 + 1;
    case '\t':
    case '\f':
      pvVar5 = (void *)((this->field_0).string_value)->_M_string_length;
      goto LAB_0021e4f5;
    case '\n':
      pvVar5 = (*(((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                 impl_).options_.block_alloc)((size_t)(this->field_0).repeated_string_value);
      goto LAB_0021e507;
    case '\v':
      ptVar2 = (type_info *)(this->field_0).repeated_string_value;
      if ((this->field_0xa & 0x10) == 0) {
        pvVar5 = (**(code **)(*(long *)ptVar2 + 0x48))((size_t)ptVar2);
      }
      else {
        pvVar5 = (void *)(**(code **)(*(long *)ptVar2 + 0x58))(ptVar2,(uint64)pLVar4,in_RDX);
      }
LAB_0021e4f5:
      sVar16 = sVar16 + (long)pvVar5;
      break;
    case '\r':
      pvVar5 = (void *)(ulong)(this->field_0).uint32_value;
      break;
    case '\x11':
      uVar14 = (this->field_0).int32_value >> 0x1f ^ (this->field_0).int32_value * 2 | 1;
      iVar23 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> iVar23 == 0; iVar23 = iVar23 + -1) {
        }
      }
      goto LAB_0021e4fe;
    case '\x12':
      uVar17 = (this->field_0).int64_value >> 0x3f ^ (this->field_0).int64_value * 2;
LAB_0021e3d3:
      lVar15 = 0x3f;
      if ((uVar17 | 1) != 0) {
        for (; (uVar17 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      iVar23 = (int)lVar15;
      goto LAB_0021e4fe;
    default:
      return sVar16;
    }
    uVar14 = (uint)pvVar5 | 1;
    iVar23 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
LAB_0021e4fe:
    pvVar5 = (void *)(ulong)(iVar23 * 9 + 0x49U >> 6);
LAB_0021e507:
    return sVar16 + (long)pvVar5;
  }
  FVar1 = this->type;
  if (this->is_packed == true) {
    if ((byte)(FVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      uVar17 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case '\x02':
    case '\a':
    case '\x0f':
      uVar17 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case '\x03':
      pRVar20 = (this->field_0).repeated_int64_value;
      if (pRVar20->current_size_ < 1) goto switchD_0021dcd9_default;
      uVar17 = 0;
      iVar23 = 0;
      do {
        puVar10 = (ulong *)RepeatedField<long>::Get(pRVar20,iVar23);
        lVar15 = 0x3f;
        if ((*puVar10 | 1) != 0) {
          for (; (*puVar10 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        uVar17 = uVar17 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar20 = (this->field_0).repeated_int64_value;
      } while (iVar23 < pRVar20->current_size_);
      break;
    case '\x04':
      pRVar21 = (this->field_0).repeated_uint64_value;
      if (pRVar21->current_size_ < 1) goto switchD_0021dcd9_default;
      uVar17 = 0;
      iVar23 = 0;
      do {
        puVar11 = RepeatedField<unsigned_long>::Get(pRVar21,iVar23);
        lVar15 = 0x3f;
        if ((*puVar11 | 1) != 0) {
          for (; (*puVar11 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        uVar17 = uVar17 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar21 = (this->field_0).repeated_uint64_value;
      } while (iVar23 < pRVar21->current_size_);
      break;
    case '\x05':
      pRVar19 = (this->field_0).repeated_int32_value;
      if (pRVar19->current_size_ < 1) goto switchD_0021dcd9_default;
      uVar17 = 0;
      iVar23 = 0;
      do {
        puVar7 = (uint *)RepeatedField<int>::Get(pRVar19,iVar23);
        if ((int)*puVar7 < 0) {
          uVar9 = 10;
        }
        else {
          uVar14 = *puVar7 | 1;
          iVar3 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar9 = (ulong)(iVar3 * 9 + 0x49U >> 6);
        }
        uVar17 = uVar17 + uVar9;
        iVar23 = iVar23 + 1;
        pRVar19 = (this->field_0).repeated_int32_value;
      } while (iVar23 < pRVar19->current_size_);
      break;
    case '\b':
      uVar17 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x647);
      pLVar4 = LogMessage::operator<<(&local_70,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
    default:
switchD_0021dcd9_default:
      this->cached_size = 0;
      return 0;
    case '\r':
      pRVar18 = (this->field_0).repeated_uint32_value;
      if (pRVar18->current_size_ < 1) goto switchD_0021dcd9_default;
      uVar17 = 0;
      iVar23 = 0;
      do {
        puVar7 = RepeatedField<unsigned_int>::Get(pRVar18,iVar23);
        iVar3 = 0x1f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar17 = uVar17 + (iVar3 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar18 = (this->field_0).repeated_uint32_value;
      } while (iVar23 < pRVar18->current_size_);
      break;
    case '\x0e':
      pRVar19 = (this->field_0).repeated_int32_value;
      if (pRVar19->current_size_ < 1) goto switchD_0021dcd9_default;
      uVar17 = 0;
      iVar23 = 0;
      do {
        puVar7 = (uint *)RepeatedField<int>::Get(pRVar19,iVar23);
        if ((int)*puVar7 < 0) {
          uVar9 = 10;
        }
        else {
          uVar14 = *puVar7 | 1;
          iVar3 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar9 = (ulong)(iVar3 * 9 + 0x49U >> 6);
        }
        uVar17 = uVar17 + uVar9;
        iVar23 = iVar23 + 1;
        pRVar19 = (this->field_0).repeated_int32_value;
      } while (iVar23 < pRVar19->current_size_);
      break;
    case '\x11':
      pRVar19 = (this->field_0).repeated_int32_value;
      if (pRVar19->current_size_ < 1) goto switchD_0021dcd9_default;
      uVar17 = 0;
      iVar23 = 0;
      do {
        piVar6 = RepeatedField<int>::Get(pRVar19,iVar23);
        uVar14 = *piVar6 >> 0x1f ^ *piVar6 * 2 | 1;
        iVar3 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar17 = uVar17 + (iVar3 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar19 = (this->field_0).repeated_int32_value;
      } while (iVar23 < pRVar19->current_size_);
      break;
    case '\x12':
      pRVar20 = (this->field_0).repeated_int64_value;
      if (pRVar20->current_size_ < 1) goto switchD_0021dcd9_default;
      uVar17 = 0;
      iVar23 = 0;
      do {
        plVar8 = RepeatedField<long>::Get(pRVar20,iVar23);
        uVar9 = *plVar8 >> 0x3f ^ *plVar8 * 2 | 1;
        lVar15 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        uVar17 = uVar17 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar20 = (this->field_0).repeated_int64_value;
      } while (iVar23 < pRVar20->current_size_);
    }
    this->cached_size = (uint)uVar17;
    if (uVar17 == 0) {
switchD_0021df05_default:
      return 0;
    }
    uVar14 = (uint)uVar17 | 1;
    iVar23 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
    pvVar5 = (void *)(ulong)(iVar23 * 9 + 0x49U >> 6);
    uVar14 = number * 8 + 3;
    iVar23 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
    sVar16 = uVar17 + (iVar23 * 9 + 0x49U >> 6);
    goto LAB_0021e507;
  }
  if ((byte)(FVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
               ,0x3c);
    pLVar4 = LogMessage::operator<<
                       (&local_70,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_31,pLVar4);
    LogMessage::~LogMessage(&local_70);
    bVar25 = (byte)(this->type - 0x13) < 0xee;
    FVar24 = this->type;
  }
  else {
    bVar25 = false;
    FVar24 = FVar1;
  }
  uVar14 = number * 8 + 1;
  iVar23 = 0x1f;
  if (uVar14 != 0) {
    for (; uVar14 >> iVar23 == 0; iVar23 = iVar23 + -1) {
    }
  }
  lVar15 = (ulong)(iVar23 * 9 + 0x49U >> 6) << (FVar1 == '\n');
  if (bVar25) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
               ,0x3c);
    pLVar4 = LogMessage::operator<<
                       (&local_70,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_31,pLVar4);
    LogMessage::~LogMessage(&local_70);
  }
  switch(FVar24) {
  case '\x01':
  case '\x06':
  case '\x10':
    lVar15 = lVar15 + 8;
    goto LAB_0021e2cb;
  case '\x02':
  case '\a':
  case '\x0f':
    lVar15 = lVar15 + 4;
    goto LAB_0021e2cb;
  case '\x03':
    pRVar20 = (this->field_0).repeated_int64_value;
    sVar16 = lVar15 * (ulong)(uint)pRVar20->current_size_;
    if (0 < pRVar20->current_size_) {
      iVar23 = 0;
      do {
        puVar10 = (ulong *)RepeatedField<long>::Get(pRVar20,iVar23);
        lVar15 = 0x3f;
        if ((*puVar10 | 1) != 0) {
          for (; (*puVar10 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        sVar16 = sVar16 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar20 = (this->field_0).repeated_int64_value;
      } while (iVar23 < pRVar20->current_size_);
    }
    break;
  case '\x04':
    pRVar21 = (this->field_0).repeated_uint64_value;
    sVar16 = lVar15 * (ulong)(uint)pRVar21->current_size_;
    if (0 < pRVar21->current_size_) {
      iVar23 = 0;
      do {
        puVar11 = RepeatedField<unsigned_long>::Get(pRVar21,iVar23);
        lVar15 = 0x3f;
        if ((*puVar11 | 1) != 0) {
          for (; (*puVar11 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        sVar16 = sVar16 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar21 = (this->field_0).repeated_uint64_value;
      } while (iVar23 < pRVar21->current_size_);
    }
    break;
  case '\x05':
    pRVar19 = (this->field_0).repeated_int32_value;
    sVar16 = lVar15 * (ulong)(uint)pRVar19->current_size_;
    if (0 < pRVar19->current_size_) {
      iVar23 = 0;
      do {
        puVar7 = (uint *)RepeatedField<int>::Get(pRVar19,iVar23);
        if ((int)*puVar7 < 0) {
          uVar17 = 10;
        }
        else {
          uVar14 = *puVar7 | 1;
          iVar3 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar17 = (ulong)(iVar3 * 9 + 0x49U >> 6);
        }
        sVar16 = sVar16 + uVar17;
        iVar23 = iVar23 + 1;
        pRVar19 = (this->field_0).repeated_int32_value;
      } while (iVar23 < pRVar19->current_size_);
    }
    break;
  case '\b':
    lVar15 = lVar15 + 1;
LAB_0021e2cb:
    sVar16 = lVar15 * (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
    break;
  case '\t':
    psVar22 = (this->field_0).string_value;
    uVar14 = (uint)psVar22->_M_string_length;
    sVar16 = lVar15 * (ulong)uVar14;
    if (0 < (int)uVar14) {
      iVar23 = 0;
      do {
        pTVar13 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar22,iVar23);
        uVar14 = (uint)pTVar13->_M_string_length | 1;
        iVar3 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar16 = sVar16 + pTVar13->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        psVar22 = (this->field_0).string_value;
      } while (iVar23 < (int)psVar22->_M_string_length);
    }
    break;
  case '\n':
    psVar22 = (this->field_0).string_value;
    uVar14 = (uint)psVar22->_M_string_length;
    sVar16 = lVar15 * (ulong)uVar14;
    if (0 < (int)uVar14) {
      iVar23 = 0;
      do {
        pTVar12 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar22,iVar23);
        iVar3 = (*pTVar12->_vptr_MessageLite[9])(pTVar12);
        sVar16 = sVar16 + CONCAT44(extraout_var,iVar3);
        iVar23 = iVar23 + 1;
        psVar22 = (this->field_0).string_value;
      } while (iVar23 < (int)psVar22->_M_string_length);
    }
    break;
  case '\v':
    psVar22 = (this->field_0).string_value;
    uVar14 = (uint)psVar22->_M_string_length;
    sVar16 = lVar15 * (ulong)uVar14;
    if (0 < (int)uVar14) {
      iVar23 = 0;
      do {
        pTVar12 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar22,iVar23);
        uVar14 = (*pTVar12->_vptr_MessageLite[9])(pTVar12);
        iVar3 = 0x1f;
        if ((uVar14 | 1) != 0) {
          for (; (uVar14 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar16 = sVar16 + CONCAT44(extraout_var_00,uVar14) + (ulong)(iVar3 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        psVar22 = (this->field_0).string_value;
      } while (iVar23 < (int)psVar22->_M_string_length);
    }
    break;
  case '\f':
    psVar22 = (this->field_0).string_value;
    uVar14 = (uint)psVar22->_M_string_length;
    sVar16 = lVar15 * (ulong)uVar14;
    if (0 < (int)uVar14) {
      iVar23 = 0;
      do {
        pTVar13 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar22,iVar23);
        uVar14 = (uint)pTVar13->_M_string_length | 1;
        iVar3 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar16 = sVar16 + pTVar13->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        psVar22 = (this->field_0).string_value;
      } while (iVar23 < (int)psVar22->_M_string_length);
    }
    break;
  case '\r':
    pRVar18 = (this->field_0).repeated_uint32_value;
    sVar16 = lVar15 * (ulong)(uint)pRVar18->current_size_;
    if (0 < pRVar18->current_size_) {
      iVar23 = 0;
      do {
        puVar7 = RepeatedField<unsigned_int>::Get(pRVar18,iVar23);
        iVar3 = 0x1f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar16 = sVar16 + (iVar3 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar18 = (this->field_0).repeated_uint32_value;
      } while (iVar23 < pRVar18->current_size_);
    }
    break;
  case '\x0e':
    pRVar19 = (this->field_0).repeated_int32_value;
    sVar16 = lVar15 * (ulong)(uint)pRVar19->current_size_;
    if (0 < pRVar19->current_size_) {
      iVar23 = 0;
      do {
        puVar7 = (uint *)RepeatedField<int>::Get(pRVar19,iVar23);
        if ((int)*puVar7 < 0) {
          uVar17 = 10;
        }
        else {
          uVar14 = *puVar7 | 1;
          iVar3 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar17 = (ulong)(iVar3 * 9 + 0x49U >> 6);
        }
        sVar16 = sVar16 + uVar17;
        iVar23 = iVar23 + 1;
        pRVar19 = (this->field_0).repeated_int32_value;
      } while (iVar23 < pRVar19->current_size_);
    }
    break;
  case '\x11':
    pRVar19 = (this->field_0).repeated_int32_value;
    sVar16 = lVar15 * (ulong)(uint)pRVar19->current_size_;
    if (0 < pRVar19->current_size_) {
      iVar23 = 0;
      do {
        piVar6 = RepeatedField<int>::Get(pRVar19,iVar23);
        uVar14 = *piVar6 >> 0x1f ^ *piVar6 * 2 | 1;
        iVar3 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar16 = sVar16 + (iVar3 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar19 = (this->field_0).repeated_int32_value;
      } while (iVar23 < pRVar19->current_size_);
    }
    break;
  case '\x12':
    pRVar20 = (this->field_0).repeated_int64_value;
    sVar16 = lVar15 * (ulong)(uint)pRVar20->current_size_;
    if (0 < pRVar20->current_size_) {
      iVar23 = 0;
      do {
        plVar8 = RepeatedField<long>::Get(pRVar20,iVar23);
        uVar17 = *plVar8 >> 0x3f ^ *plVar8 * 2 | 1;
        lVar15 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        sVar16 = sVar16 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar23 = iVar23 + 1;
        pRVar20 = (this->field_0).repeated_int64_value;
      } while (iVar23 < pRVar20->current_size_);
    }
    break;
  default:
    goto switchD_0021df05_default;
  }
  return sVar16;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                     \
          repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += WireFormatLite::k##CAMELCASE##Size *               \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = ToCachedSize(result);
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    result += tag_size * FromIntSize(repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {        \
      result += WireFormatLite::CAMELCASE##Size(                            \
          repeated_##LOWERCASE##_value->Get(i));                            \
    }                                                                       \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *  \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_value);
      HANDLE_TYPE(INT64, Int64, int64_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_value);
      HANDLE_TYPE(SINT32, SInt32, int32_value);
      HANDLE_TYPE(SINT64, SInt64, int64_value);
      HANDLE_TYPE(STRING, String, *string_value);
      HANDLE_TYPE(BYTES, Bytes, *string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          size_t size = lazymessage_value->ByteSizeLong();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}